

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint64_t farmhashxo::Hash64(char *s,size_t len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar13 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                   (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar13 >> 0x2f ^ uVar13) * -0x651e95c4d06fbfb1;
        }
        lVar10 = len * 2 + -0x651e95c4d06fbfb1;
        uVar13 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar10;
        uVar13 = (uVar13 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar13) * lVar10;
        uVar13 = uVar13 >> 0x2f ^ uVar13;
      }
      else {
        uVar13 = *(ulong *)(s + (len - 8));
        lVar10 = len * 2 + -0x651e95c4d06fbfb1;
        uVar4 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar5 = ((uVar4 >> 0x19 | uVar4 << 0x27) + uVar13) * lVar10;
        uVar13 = ((uVar13 >> 0x25 | uVar13 << 0x1b) * lVar10 + uVar4 ^ uVar5) * lVar10;
        uVar13 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * lVar10;
        uVar13 = uVar13 >> 0x2f ^ uVar13;
      }
    }
    else {
      lVar10 = len * 2 + -0x651e95c4d06fbfb1;
      uVar5 = *(long *)(s + (len - 8)) * lVar10;
      uVar13 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
      uVar4 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar5;
      uVar13 = ((uVar5 >> 0x1e | uVar5 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar4) * lVar10;
      uVar13 = (uVar13 >> 0x2f ^ uVar4 ^ uVar13) * lVar10;
      uVar13 = uVar13 >> 0x2f ^ uVar13;
    }
  }
  else {
    if (0x40 < len) {
      if (len < 0x61) {
        lVar10 = len * 2 + -0x651e95c4d06fc023;
        uVar4 = *(long *)(s + 0x18) * -0x651e95c4d06fc023;
        uVar13 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
        uVar5 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
        uVar5 = (uVar5 >> 0x12 | uVar5 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar4;
        uVar13 = ((uVar4 >> 0x1e | uVar4 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                  *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 ^ uVar5) * -0x651e95c4d06fc023;
        uVar19 = *(long *)(s + 0x38) * lVar10;
        uVar5 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * -0x651e95c4d06fc023;
        uVar13 = *(long *)(s + 0x20) * -0x4b6d499041670d8d + *(long *)(s + 0x28);
        uVar4 = *(long *)(s + 0x28) + 0x9ae16a3b2f90404f;
        uVar18 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)(s + 0x20) * -0x4b6d499041670d8d +
                 uVar19;
        uVar4 = *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + *(long *)(s + (len - 0x18));
        uVar12 = *(long *)(s + (len - 0x18)) + 0x9ae16a3b2f90404f;
        uVar13 = ((uVar19 >> 0x1e | uVar19 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                  *(long *)(s + 0x30) * -0x651e95c4d06fbfb1 ^ uVar18) * lVar10;
        uVar19 = *(long *)(s + (len - 8)) * lVar10;
        uVar13 = (uVar13 >> 0x2f ^ uVar18 ^ uVar13) * lVar10;
        uVar12 = (uVar12 >> 0x12 | uVar12 << 0x2e) +
                 *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + uVar19 +
                 (uVar13 >> 0x2f ^ uVar13);
        uVar4 = ((uVar19 >> 0x1e | uVar19 << 0x22) + (uVar4 >> 0x2b | uVar4 * 0x200000) +
                 *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 + (uVar5 >> 0x2f ^ uVar5) ^
                uVar12) * lVar10;
        uVar4 = (uVar4 >> 0x2f ^ uVar12 ^ uVar4) * lVar10;
        return ((uVar13 >> 0x15) + (uVar5 >> 0x11) + (uVar4 >> 0x2f ^ uVar4) * 9) * lVar10;
      }
      if (len < 0x101) {
        if (0x20 < len) {
          if (len < 0x41) {
            lVar10 = len * 2 + -0x651e95c4d06fbfb1;
            lVar6 = *(long *)s * -0x651e95c4d06fbfb1;
            uVar5 = *(long *)(s + (len - 8)) * lVar10;
            uVar13 = lVar6 + *(long *)(s + 8);
            uVar12 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
            uVar4 = lVar6 + *(long *)(s + 0x18);
            uVar18 = (uVar5 >> 0x1e | uVar5 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                     *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
            uVar5 = (uVar12 >> 0x12 | uVar12 << 0x2e) + lVar6 + uVar5;
            uVar13 = (uVar18 ^ uVar5) * lVar10;
            uVar12 = (uVar18 + *(long *)(s + (len - 0x20))) * lVar10;
            uVar5 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * lVar10;
            uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)(s + 0x10) * lVar10 + uVar12;
            uVar13 = *(long *)(s + 0x10) * lVar10 + *(long *)(s + 0x18);
            uVar13 = ((uVar12 >> 0x1e | uVar12 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                      ((uVar5 >> 0x2f ^ uVar5) * lVar10 + *(long *)(s + (len - 0x18))) * lVar10 ^
                     uVar4) * lVar10;
            uVar13 = (uVar13 >> 0x2f ^ uVar4 ^ uVar13) * lVar10;
            uVar7 = (uVar13 >> 0x2f ^ uVar13) * lVar10;
          }
          else {
            lVar14 = *(long *)s + 0x1529cba0ca458ff;
            lVar16 = 0x226bb95b4e64b6d4;
            uVar5 = 0x134a747f856d0526;
            uVar18 = 0;
            lVar6 = 0;
            uVar4 = 0;
            lVar20 = 0;
            lVar10 = 0;
            uVar13 = len - 1 & 0xffffffffffffffc0;
            uVar12 = (ulong)((uint)(len - 1) & 0x3f);
            do {
              lVar1 = uVar18 + 0x30;
              lVar11 = uVar18 + 0x28;
              lVar2 = uVar18 + 0x10;
              lVar9 = lVar10 * -0x4b6d499041670d8d + *(long *)(s + uVar18);
              uVar17 = lVar16 + lVar10 + *(long *)(s + lVar1);
              uVar15 = lVar14 + lVar20 + lVar16 + *(long *)(s + uVar18 + 8);
              uVar19 = *(long *)(s + uVar18 + 8) + lVar9 + *(long *)(s + lVar2);
              lVar16 = lVar20 + *(long *)(s + lVar11) +
                       (uVar17 >> 0x2a | uVar17 * 0x400000) * -0x4b6d499041670d8d;
              lVar10 = uVar18 + 0x18;
              lVar14 = (uVar5 + lVar6 >> 0x21 | (uVar5 + lVar6) * 0x80000000) * -0x4b6d499041670d8d;
              uVar5 = (uVar15 >> 0x25 | uVar15 * 0x8000000) * -0x4b6d499041670d8d ^ uVar4;
              lVar8 = uVar4 + lVar14 + *(long *)(s + uVar18 + 0x20);
              lVar20 = uVar19 + *(long *)(s + lVar10);
              lVar3 = uVar18 + 0x38;
              uVar18 = uVar18 + 0x40;
              uVar4 = lVar6 + lVar9 + *(long *)(s + lVar10) + uVar5;
              uVar15 = *(long *)(s + lVar11) + *(long *)(s + lVar1) + lVar8;
              lVar10 = lVar9 + (uVar19 >> 0x2c | uVar19 * 0x100000) +
                       (uVar4 >> 0x15 | uVar4 << 0x2b);
              uVar4 = *(long *)(s + lVar2) + lVar8 + lVar16 + *(long *)(s + lVar3);
              lVar6 = uVar15 + *(long *)(s + lVar3);
              uVar4 = lVar8 + (uVar15 >> 0x2c | uVar15 * 0x100000) + (uVar4 >> 0x15 | uVar4 << 0x2b)
              ;
            } while (uVar13 != uVar18);
            lVar1 = (uVar5 & 0xff) * 2 + -0x4b6d499041670d8d;
            lVar11 = lVar10 * lVar1 + *(long *)(s + uVar12 + (uVar13 - 0x3f));
            lVar20 = lVar20 + lVar6 + uVar12;
            lVar6 = lVar6 + uVar12 + lVar20;
            uVar5 = uVar5 + lVar6;
            uVar15 = lVar16 + lVar10 + *(long *)(s + uVar12 + (uVar13 - 0xf));
            uVar18 = lVar14 + lVar16 + *(long *)(s + uVar12 + (uVar13 - 0x37)) + lVar20;
            uVar17 = *(long *)(s + uVar12 + (uVar13 - 0x37)) +
                     *(long *)(s + uVar12 + (uVar13 - 0x2f)) + lVar11;
            uVar5 = uVar5 >> 0x21 | uVar5 * 0x80000000;
            uVar19 = uVar4 * 9 ^ (uVar18 >> 0x25 | uVar18 * 0x8000000) * lVar1;
            uVar15 = lVar20 * 9 + *(long *)(s + uVar12 + (uVar13 - 0x17)) +
                     (uVar15 >> 0x2a | uVar15 * 0x400000) * lVar1;
            uVar18 = lVar6 + lVar11 + uVar19 + *(long *)(s + uVar12 + (uVar13 - 0x27));
            lVar10 = uVar5 * lVar1 + uVar4 + *(long *)(s + uVar12 + (uVar13 - 0x1f));
            uVar21 = *(long *)(s + uVar12 + (uVar13 - 0x17)) +
                     *(long *)(s + uVar12 + (uVar13 - 0xf)) + lVar10;
            uVar4 = *(long *)(s + uVar12 + (uVar13 - 0x2f)) + uVar15 +
                    *(long *)(s + uVar12 + (uVar13 - 7)) + lVar10;
            uVar22 = uVar21 + *(long *)(s + uVar12 + (uVar13 - 7));
            uVar4 = (uVar21 >> 0x2c | uVar21 * 0x100000) + lVar10 + (uVar4 >> 0x15 | uVar4 << 0x2b);
            uVar13 = (uVar17 + *(long *)(s + uVar12 + (uVar13 - 0x27)) ^ uVar22) * lVar1;
            uVar12 = ((uVar17 >> 0x2c | uVar17 * 0x100000) + lVar11 +
                      (uVar18 >> 0x15 | uVar18 << 0x2b) ^ uVar4) * lVar1;
            uVar13 = (uVar13 >> 0x2f ^ uVar22 ^ uVar13) * lVar1;
            uVar13 = (uVar12 >> 0x2f ^ uVar4 ^ uVar12) * lVar1;
            uVar13 = ((uVar13 >> 0x2f ^ uVar13) + uVar5) * lVar1;
            uVar13 = ((uVar15 >> 0x2f ^ uVar15) * -0x3c5a37a36834ced9 + uVar19 +
                      (uVar13 >> 0x2f ^ uVar13) * lVar1 ^ uVar13) * lVar1;
            uVar13 = (uVar13 >> 0x2f ^ uVar13 ^ uVar13) * lVar1;
            uVar7 = (uVar13 >> 0x2f ^ uVar13) * lVar1;
          }
          return uVar7;
        }
        if (len < 0x11) {
          if (len < 8) {
            if (len < 4) {
              if (len == 0) {
                return 0x9ae16a3b2f90404f;
              }
              uVar13 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                       (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
              return (uVar13 >> 0x2f ^ uVar13) * -0x651e95c4d06fbfb1;
            }
            lVar10 = len * 2 + -0x651e95c4d06fbfb1;
            uVar13 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar10;
            uVar13 = (uVar13 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar13) * lVar10;
            uVar13 = uVar13 >> 0x2f ^ uVar13;
          }
          else {
            uVar13 = *(ulong *)(s + (len - 8));
            lVar10 = len * 2 + -0x651e95c4d06fbfb1;
            uVar4 = *(long *)s + 0x9ae16a3b2f90404f;
            uVar5 = ((uVar4 >> 0x19 | uVar4 << 0x27) + uVar13) * lVar10;
            uVar13 = ((uVar13 >> 0x25 | uVar13 << 0x1b) * lVar10 + uVar4 ^ uVar5) * lVar10;
            uVar13 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * lVar10;
            uVar13 = uVar13 >> 0x2f ^ uVar13;
          }
        }
        else {
          lVar10 = len * 2 + -0x651e95c4d06fbfb1;
          uVar5 = *(long *)(s + (len - 8)) * lVar10;
          uVar13 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
          uVar4 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
          uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar5;
          uVar13 = ((uVar5 >> 0x1e | uVar5 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                    *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar4) * lVar10;
          uVar13 = (uVar13 >> 0x2f ^ uVar4 ^ uVar13) * lVar10;
          uVar13 = uVar13 >> 0x2f ^ uVar13;
        }
        return uVar13 * lVar10;
      }
      uVar7 = farmhashuo::Hash64(s,len);
      return uVar7;
    }
    lVar10 = len * 2 + -0x651e95c4d06fbfcf;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)(s + (len - 0x20));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)s;
    auVar27 = vpunpcklqdq_avx(auVar27,auVar29);
    auVar28._8_8_ = 0xb492b66fbe98f273;
    auVar28._0_8_ = 0xb492b66fbe98f273;
    auVar23 = vpmullq_avx512vl(auVar27,auVar28);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(s + 0x10);
    auVar27 = vpunpcklqdq_avx(auVar25,auVar26);
    auVar32._8_8_ = 0x9ae16a3b2f90404f;
    auVar32._0_8_ = 0x9ae16a3b2f90404f;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)(s + (len - 0x18));
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *(ulong *)(s + 8);
    auVar28 = vpunpcklqdq_avx(auVar33,auVar34);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)(s + (len - 8));
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(s + 0x18);
    auVar31 = vpunpcklqdq_avx(auVar31,auVar24);
    auVar30._8_8_ = 0x9ae16a3b2f904031;
    auVar30._0_8_ = 0x9ae16a3b2f904031;
    auVar24 = vpmullq_avx512vl(auVar27,auVar32);
    auVar27 = vpaddq_avx(auVar28,auVar32);
    auVar25 = vprolq_avx512vl(auVar27,0x2e);
    auVar27 = vpaddq_avx(auVar23,auVar28);
    auVar26 = vprolq_avx512vl(auVar27,0x15);
    auVar29 = vpinsrq_avx(auVar30,lVar10,0);
    auVar27 = vpmullq_avx512vl(auVar31,auVar29);
    auVar28 = vprolq_avx512vl(auVar27,0x22);
    auVar27 = vpaddq_avx(auVar25,auVar27);
    auVar27 = vpaddq_avx(auVar27,auVar23);
    auVar28 = vpaddq_avx(auVar28,auVar24);
    auVar28 = vpaddq_avx(auVar28,auVar26);
    auVar28 = vpmullq_avx512vl(auVar28 ^ auVar27,auVar29);
    auVar31 = vpsrlq_avx(auVar28,0x2f);
    auVar27 = vpternlogq_avx512vl(auVar31,auVar27,auVar28,0x96);
    auVar27 = vpmullq_avx512vl(auVar27,auVar29);
    auVar28 = vpsrlq_avx(auVar27,0x2f);
    lVar6 = vpextrq_avx(auVar28 ^ auVar27,1);
    uVar13 = lVar6 + SUB168(auVar28 ^ auVar27,0) * lVar10;
  }
  return uVar13 * lVar10;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhashna::HashLen0to16(s, len);
    } else {
      return farmhashna::HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  } else if (len <= 96) {
    return HashLen65to96(s, len);
  } else if (len <= 256) {
    return farmhashna::Hash64(s, len);
  } else {
    return farmhashuo::Hash64(s, len);
  }
}